

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O1

int __thiscall CppJieba::Trie::init(Trie *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TrieNode *pTVar2;
  string local_30;
  
  if (this->_initFlag == true) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"already initted!","");
    Limonp::Logger::LoggingF(3,"Trie.hpp",0x59,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    iVar1 = 0;
  }
  else {
    pTVar2 = (TrieNode *)operator_new(0x40);
    (pTVar2->hmap)._M_h._M_buckets = &(pTVar2->hmap)._M_h._M_single_bucket;
    (pTVar2->hmap)._M_h._M_bucket_count = 1;
    (pTVar2->hmap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pTVar2->hmap)._M_h._M_element_count = 0;
    (pTVar2->hmap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    pTVar2->nodeInfoVecPos = 0;
    (pTVar2->hmap)._M_h._M_rehash_policy._M_next_resize = 0;
    (pTVar2->hmap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pTVar2->isLeaf = false;
    this->_root = pTVar2;
    this->_initFlag = true;
    iVar1 = (int)CONCAT71((int7)((ulong)pTVar2 >> 8),1);
  }
  return iVar1;
}

Assistant:

bool init()
            {
                if(_getInitFlag())
                {
                    LogError("already initted!");
                    return false;
                }

                try
                {
                    _root = new TrieNode;
                }
                catch(const bad_alloc& e)
                {
                    return false;
                }
                if(NULL == _root)
                {
                    return false;
                }
                _setInitFlag(true);
                return true;
            }